

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O2

void __thiscall miniros::ROSOutAppender::~ROSOutAppender(ROSOutAppender *this)

{
  (this->super_LogAppender)._vptr_LogAppender = (_func_int **)&PTR__ROSOutAppender_002f1308;
  this->shutting_down_ = true;
  std::mutex::lock(&this->queue_mutex_);
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  std::thread::join();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->topic_manager_).
              super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::thread::~thread(&this->publish_thread_);
  std::condition_variable::~condition_variable(&this->queue_condition_);
  std::
  vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
  ::~vector(&this->log_queue_);
  std::__cxx11::string::~string((string *)&this->last_error_);
  return;
}

Assistant:

ROSOutAppender::~ROSOutAppender()
{
  shutting_down_ = true;

  {
    std::scoped_lock<std::mutex> lock(queue_mutex_);
    queue_condition_.notify_all();
  }

  publish_thread_.join();
}